

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glsLongStressCase.cpp
# Opt level: O1

void __thiscall deqp::gls::LongStressCaseInternal::Program::build(Program *this,TestLog *log)

{
  GLuint GVar1;
  bool bVar2;
  qpShaderType qVar3;
  qpShaderType qVar4;
  TestError *this_00;
  deUint32 extraout_EDX;
  deUint32 extraout_EDX_00;
  deUint32 programGL;
  deUint32 shaderGL;
  deUint32 shaderGL_00;
  bool bVar5;
  int success;
  string local_158;
  bool local_138;
  long *local_130 [2];
  long local_120 [2];
  string local_110;
  string local_f0;
  LogShader local_d0;
  LogShader local_80;
  
  GVar1 = this->m_vertShaderGL;
  glwCompileShader(GVar1);
  bVar5 = false;
  local_d0.m_type = QP_SHADER_TYPE_VERTEX;
  glwGetShaderiv(GVar1,0x8b81,(GLint *)&local_d0);
  qVar3 = local_d0.m_type;
  GVar1 = this->m_fragShaderGL;
  glwCompileShader(GVar1);
  local_d0.m_type = QP_SHADER_TYPE_VERTEX;
  glwGetShaderiv(GVar1,0x8b81,(GLint *)&local_d0);
  qVar4 = local_d0.m_type;
  bVar2 = local_d0.m_type != QP_SHADER_TYPE_FRAGMENT;
  programGL = extraout_EDX;
  if (!bVar2 && qVar3 == QP_SHADER_TYPE_FRAGMENT) {
    GVar1 = this->m_programGL;
    glwLinkProgram(GVar1);
    local_d0.m_type = QP_SHADER_TYPE_VERTEX;
    glwGetProgramiv(GVar1,0x8b82,(GLint *)&local_d0);
    bVar5 = local_d0.m_type == QP_SHADER_TYPE_FRAGMENT;
    programGL = extraout_EDX_00;
  }
  if (((qVar3 == QP_SHADER_TYPE_FRAGMENT) && (qVar4 == QP_SHADER_TYPE_FRAGMENT)) && (bVar5 != false)
     ) {
    this->m_isBuilt = true;
    return;
  }
  if (bVar2 || qVar3 != QP_SHADER_TYPE_FRAGMENT) {
    local_158._M_dataplus._M_p = (pointer)&local_158.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_158,"");
  }
  else {
    getProgramInfoLog_abi_cxx11_(&local_158,(gls *)(ulong)this->m_programGL,programGL);
  }
  local_138 = bVar5;
  local_130[0] = local_120;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_130,local_158._M_dataplus._M_p,
             local_158._M_dataplus._M_p + local_158._M_string_length);
  tcu::TestLog::startShaderProgram(log,local_138,(char *)local_130[0]);
  getShaderInfoLog_abi_cxx11_(&local_f0,(gls *)(ulong)this->m_vertShaderGL,shaderGL);
  tcu::LogShader::LogShader
            (&local_d0,QP_SHADER_TYPE_VERTEX,&this->m_vertSource,qVar3 == QP_SHADER_TYPE_FRAGMENT,
             &local_f0);
  tcu::TestLog::writeShader
            (log,local_d0.m_type,local_d0.m_source._M_dataplus._M_p,local_d0.m_compileOk,
             local_d0.m_infoLog._M_dataplus._M_p);
  getShaderInfoLog_abi_cxx11_(&local_110,(gls *)(ulong)this->m_fragShaderGL,shaderGL_00);
  tcu::LogShader::LogShader
            (&local_80,QP_SHADER_TYPE_FRAGMENT,&this->m_fragSource,qVar4 == QP_SHADER_TYPE_FRAGMENT,
             &local_110);
  tcu::TestLog::writeShader
            (log,local_80.m_type,local_80.m_source._M_dataplus._M_p,local_80.m_compileOk,
             local_80.m_infoLog._M_dataplus._M_p);
  tcu::TestLog::endShaderProgram(log);
  tcu::LogShader::~LogShader(&local_80);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_110._M_dataplus._M_p != &local_110.field_2) {
    operator_delete(local_110._M_dataplus._M_p,local_110.field_2._M_allocated_capacity + 1);
  }
  tcu::LogShader::~LogShader(&local_d0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_f0._M_dataplus._M_p != &local_f0.field_2) {
    operator_delete(local_f0._M_dataplus._M_p,local_f0.field_2._M_allocated_capacity + 1);
  }
  if (local_130[0] != local_120) {
    operator_delete(local_130[0],local_120[0] + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_158._M_dataplus._M_p != &local_158.field_2) {
    operator_delete(local_158._M_dataplus._M_p,local_158.field_2._M_allocated_capacity + 1);
  }
  this_00 = (TestError *)__cxa_allocate_exception(0x38);
  local_d0._0_8_ = &local_d0.m_source._M_string_length;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_d0,"Program build failed","");
  tcu::TestError::TestError(this_00,(string *)&local_d0);
  __cxa_throw(this_00,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
}

Assistant:

void Program::build (TestLog& log)
{
	DE_ASSERT(m_hasSources);

	const bool vertCompileOk	= compileShader(m_vertShaderGL);
	const bool fragCompileOk	= compileShader(m_fragShaderGL);
	const bool attemptLink		= vertCompileOk && fragCompileOk;
	const bool linkOk			= attemptLink && linkProgram(m_programGL);

	if (!(vertCompileOk && fragCompileOk && linkOk))
	{
		log << TestLog::ShaderProgram(linkOk, attemptLink ? getProgramInfoLog(m_programGL) : string(""))
			<< TestLog::Shader(QP_SHADER_TYPE_VERTEX, m_vertSource, vertCompileOk, getShaderInfoLog(m_vertShaderGL))
			<< TestLog::Shader(QP_SHADER_TYPE_FRAGMENT, m_fragSource, fragCompileOk, getShaderInfoLog(m_fragShaderGL))
			<< TestLog::EndShaderProgram;

		throw tcu::TestError("Program build failed");
	}

	m_isBuilt = true;
}